

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

int __thiscall
TPZMatrix<std::complex<long_double>_>::SolveDirect
          (TPZMatrix<std::complex<long_double>_> *this,TPZFMatrix<std::complex<long_double>_> *B,
          DecomposeType dt,list<long,_std::allocator<long>_> *singular)

{
  int iVar1;
  uint uVar2;
  
  if (dt == ELDLt) {
    iVar1 = Solve_LDLt(this,B,singular);
    return iVar1;
  }
  if (dt == ECholesky) {
    iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x18])(this,singular);
    uVar2 = 0;
    if (iVar1 != 0) {
      iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x44])(this,B);
      uVar2 = 0;
      if (iVar1 != 0) {
        iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x45])(this,B);
        uVar2 = (uint)(iVar1 != 0);
      }
    }
  }
  else if (dt == ELU) {
    iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x10])(this);
    if (iVar1 != 0) {
      Error("LU decomposition is not a symmetric decomposition",(char *)0x0);
    }
    iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x16])(this,singular);
    if (iVar1 != 0) {
      iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x43])(this,B);
      return iVar1;
    }
    uVar2 = 0;
  }
  else {
    Error("Solve  < Unknown decomposition type >",(char *)0x0);
    uVar2 = 0;
  }
  return uVar2;
}

Assistant:

int TPZMatrix<TVar>::SolveDirect( TPZFMatrix<TVar> &B , DecomposeType dt, std::list<int64_t> &singular) {
	
	switch ( dt ) {
		case ELU:
			return( Solve_LU( &B ,singular)  );
		case ECholesky:
			return( Solve_Cholesky( &B , singular)  );
		case ELDLt:
			return( Solve_LDLt( &B, singular )  );
		default:
			Error( "Solve  < Unknown decomposition type >" );
			break;
	}
	return ( 0 );
}